

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O0

void __thiscall
LASquadtree::intersect_tile_with_cells_adaptive
          (LASquadtree *this,F32 ll_x,F32 ll_y,F32 ur_x,F32 ur_y,F32 cell_min_x,F32 cell_max_x,
          F32 cell_min_y,F32 cell_max_y,U32 level,U32 level_index)

{
  U32 local_50;
  uint local_4c;
  uint local_48;
  U32 adaptive_bit;
  U32 adaptive_pos;
  U32 cell_index;
  float cell_mid_y;
  float cell_mid_x;
  U32 level_index_local;
  U32 level_local;
  F32 cell_max_y_local;
  F32 cell_min_y_local;
  F32 cell_max_x_local;
  F32 cell_min_x_local;
  F32 ur_y_local;
  F32 ur_x_local;
  F32 ll_y_local;
  F32 ll_x_local;
  LASquadtree *this_local;
  
  cell_mid_y = (float)level_index;
  cell_mid_x = (float)level;
  level_index_local = (U32)cell_max_y;
  level_local = (U32)cell_min_y;
  cell_max_y_local = cell_max_x;
  cell_min_y_local = cell_min_x;
  cell_max_x_local = ur_y;
  cell_min_x_local = ur_x;
  ur_y_local = ll_y;
  ur_x_local = ll_x;
  _ll_y_local = this;
  local_50 = get_cell_index(this,level_index,level);
  local_48 = local_50 >> 5;
  local_4c = 1 << ((byte)local_50 & 0x1f);
  adaptive_bit = local_50;
  if (((uint)cell_mid_x < this->levels) && ((this->adaptive[local_48] & local_4c) != 0)) {
    cell_mid_x = (float)((int)cell_mid_x + 1);
    cell_mid_y = (float)((int)cell_mid_y << 2);
    cell_index = (U32)(((float)cell_min_y_local + (float)cell_max_y_local) / 2.0);
    adaptive_pos = (U32)(((float)level_local + (float)level_index_local) / 2.0);
    if ((float)cell_index < (float)cell_min_x_local) {
      if ((float)ur_x_local < (float)cell_index) {
        if ((float)adaptive_pos < (float)cell_max_x_local) {
          if ((float)ur_y_local < (float)adaptive_pos) {
            intersect_tile_with_cells_adaptive
                      (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,cell_min_y_local
                       ,(F32)cell_index,(F32)level_local,(F32)adaptive_pos,(U32)cell_mid_x,
                       (U32)cell_mid_y);
            intersect_tile_with_cells_adaptive
                      (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,(F32)cell_index,
                       cell_max_y_local,(F32)level_local,(F32)adaptive_pos,(U32)cell_mid_x,
                       (uint)cell_mid_y | 1);
            intersect_tile_with_cells_adaptive
                      (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,cell_min_y_local
                       ,(F32)cell_index,(F32)adaptive_pos,(F32)level_index_local,(U32)cell_mid_x,
                       (uint)cell_mid_y | 2);
            intersect_tile_with_cells_adaptive
                      (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,(F32)cell_index,
                       cell_max_y_local,(F32)adaptive_pos,(F32)level_index_local,(U32)cell_mid_x,
                       (uint)cell_mid_y | 3);
          }
          else {
            intersect_tile_with_cells_adaptive
                      (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,cell_min_y_local
                       ,(F32)cell_index,(F32)adaptive_pos,(F32)level_index_local,(U32)cell_mid_x,
                       (uint)cell_mid_y | 2);
            intersect_tile_with_cells_adaptive
                      (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,(F32)cell_index,
                       cell_max_y_local,(F32)adaptive_pos,(F32)level_index_local,(U32)cell_mid_x,
                       (uint)cell_mid_y | 3);
          }
        }
        else {
          intersect_tile_with_cells_adaptive
                    (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,cell_min_y_local,
                     (F32)cell_index,(F32)level_local,(F32)adaptive_pos,(U32)cell_mid_x,
                     (U32)cell_mid_y);
          intersect_tile_with_cells_adaptive
                    (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,(F32)cell_index,
                     cell_max_y_local,(F32)level_local,(F32)adaptive_pos,(U32)cell_mid_x,
                     (uint)cell_mid_y | 1);
        }
      }
      else if ((float)adaptive_pos < (float)cell_max_x_local) {
        if ((float)ur_y_local < (float)adaptive_pos) {
          intersect_tile_with_cells_adaptive
                    (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,(F32)cell_index,
                     cell_max_y_local,(F32)level_local,(F32)adaptive_pos,(U32)cell_mid_x,
                     (uint)cell_mid_y | 1);
          intersect_tile_with_cells_adaptive
                    (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,(F32)cell_index,
                     cell_max_y_local,(F32)adaptive_pos,(F32)level_index_local,(U32)cell_mid_x,
                     (uint)cell_mid_y | 3);
        }
        else {
          intersect_tile_with_cells_adaptive
                    (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,(F32)cell_index,
                     cell_max_y_local,(F32)adaptive_pos,(F32)level_index_local,(U32)cell_mid_x,
                     (uint)cell_mid_y | 3);
        }
      }
      else {
        intersect_tile_with_cells_adaptive
                  (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,(F32)cell_index,
                   cell_max_y_local,(F32)level_local,(F32)adaptive_pos,(U32)cell_mid_x,
                   (uint)cell_mid_y | 1);
      }
    }
    else if ((float)adaptive_pos < (float)cell_max_x_local) {
      if ((float)ur_y_local < (float)adaptive_pos) {
        intersect_tile_with_cells_adaptive
                  (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,cell_min_y_local,
                   (F32)cell_index,(F32)level_local,(F32)adaptive_pos,(U32)cell_mid_x,
                   (U32)cell_mid_y);
        intersect_tile_with_cells_adaptive
                  (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,cell_min_y_local,
                   (F32)cell_index,(F32)adaptive_pos,(F32)level_index_local,(U32)cell_mid_x,
                   (uint)cell_mid_y | 2);
      }
      else {
        intersect_tile_with_cells_adaptive
                  (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,cell_min_y_local,
                   (F32)cell_index,(F32)adaptive_pos,(F32)level_index_local,(U32)cell_mid_x,
                   (uint)cell_mid_y | 2);
      }
    }
    else {
      intersect_tile_with_cells_adaptive
                (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,cell_min_y_local,
                 (F32)cell_index,(F32)level_local,(F32)adaptive_pos,(U32)cell_mid_x,(U32)cell_mid_y)
      ;
    }
  }
  else {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)this->current_cells,
               (value_type_conflict *)&local_50);
  }
  return;
}

Assistant:

void LASquadtree::intersect_tile_with_cells_adaptive(const F32 ll_x, const F32 ll_y, const F32 ur_x, const F32 ur_y, const F32 cell_min_x, const F32 cell_max_x, const F32 cell_min_y, const F32 cell_max_y, U32 level, U32 level_index)
{
  volatile float cell_mid_x;
  volatile float cell_mid_y;
  U32 cell_index = get_cell_index(level_index, level);
  U32 adaptive_pos = cell_index/32;
  U32 adaptive_bit = ((U32)1) << (cell_index%32);
  if ((level < levels) && (adaptive[adaptive_pos] & adaptive_bit))
  {
    level++;
    level_index <<= 2;

    cell_mid_x = (cell_min_x + cell_max_x)/2;
    cell_mid_y = (cell_min_y + cell_max_y)/2;

    if (ur_x <= cell_mid_x)
    {
      // cell_max_x = cell_mid_x;
      if (ur_y <= cell_mid_y)
      {
        // cell_max_y = cell_mid_y;
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_min_y, cell_mid_y, level, level_index);
      }
      else if (!(ll_y < cell_mid_y))
      {
        // cell_min_y = cell_mid_y;
        // level_index |= 1;
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_mid_y, cell_max_y, level, level_index | 2);
      }
      else
      {
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_min_y, cell_mid_y, level, level_index);
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_mid_y, cell_max_y, level, level_index | 2);
      }
    }
    else if (!(ll_x < cell_mid_x))
    {
      // cell_min_x = cell_mid_x;
      // level_index |= 1;
      if (ur_y <= cell_mid_y)
      {
        // cell_max_y = cell_mid_y;
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_min_y, cell_mid_y, level, level_index | 1);
      }
      else if (!(ll_y < cell_mid_y))
      {
        // cell_min_y = cell_mid_y;
        // level_index |= 1;
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_mid_y, cell_max_y, level, level_index | 3);
      }
      else
      {
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_min_y, cell_mid_y, level, level_index | 1);
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_mid_y, cell_max_y, level, level_index | 3);
      }
    }
    else
    {
      if (ur_y <= cell_mid_y)
      {
        // cell_max_y = cell_mid_y;
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_min_y, cell_mid_y, level, level_index);
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_min_y, cell_mid_y, level, level_index | 1);
      }
      else if (!(ll_y < cell_mid_y))
      {
        // cell_min_y = cell_mid_y;
        // level_index |= 1;
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_mid_y, cell_max_y, level, level_index | 2);
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_mid_y, cell_max_y, level, level_index | 3);
      }
      else
      {
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_min_y, cell_mid_y, level, level_index);
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_min_y, cell_mid_y, level, level_index | 1);
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_mid_y, cell_max_y, level, level_index | 2);
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_mid_y, cell_max_y, level, level_index | 3);
      }
    }
  }
  else
  {
    ((my_cell_vector*)current_cells)->push_back(cell_index);
  }
}